

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O2

void TasGrid::getGaussNodesAndWeights<true>
               (int n,vector<double,_std::allocator<double>_> *ref_points,
               vector<double,_std::allocator<double>_> *ref_weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *points_cache,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *weights_cache)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  pointer pvVar5;
  pointer pdVar6;
  pointer pdVar7;
  const_iterator __begin2;
  double *pdVar8;
  ulong uVar9;
  size_t k;
  ulong uVar10;
  long lVar11;
  size_type __n;
  size_t j_1;
  ulong uVar12;
  double dVar13;
  double dVar14;
  anon_class_16_2_2767434e __unary_op;
  vector<double,_std::allocator<double>_> offdiag;
  vector<double,_std::allocator<double>_> diag;
  vector<double,_std::allocator<double>_> dummy_diag;
  vector<double,_std::allocator<double>_> dummy_offdiag;
  allocator_type local_f9;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_f8;
  double local_f0;
  _Vector_base<double,_std::allocator<double>_> local_e8;
  _Vector_base<double,_std::allocator<double>_> local_c8;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_88;
  ulong local_70;
  ulong local_68;
  _Vector_base<double,_std::allocator<double>_> local_60;
  value_type_conflict1 local_48 [3];
  
  if (gauss_quadrature_version == '\0') {
    gauss_quadrature_version = '\x01';
  }
  pdVar2 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar11 = (long)pdVar3 - (long)pdVar2;
  pdVar8 = (ref_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (ref_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_f8 = weights_cache;
  if (lVar11 != (long)pdVar4 - (long)pdVar8) {
    __assert_fail("ref_points.size() == ref_weights.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0x9e,
                  "void TasGrid::getGaussNodesAndWeights(const int, const std::vector<double> &, const std::vector<double> &, std::vector<std::vector<double>> &, std::vector<std::vector<double>> &) [is_symmetric = true]"
                 );
  }
  if (pdVar3 == pdVar2) {
    __assert_fail("ref_points.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0x9f,
                  "void TasGrid::getGaussNodesAndWeights(const int, const std::vector<double> &, const std::vector<double> &, std::vector<std::vector<double>> &, std::vector<std::vector<double>> &) [is_symmetric = true]"
                 );
  }
  local_f0 = 0.0;
  for (; pdVar8 != pdVar4; pdVar8 = pdVar8 + 1) {
    local_f0 = local_f0 + *pdVar8;
  }
  local_e8._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,lVar11 >> 3,
             (value_type_conflict1 *)&local_e8,(allocator_type *)&local_a8);
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_e8,
             (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type_conflict1 *)&local_a8,
             (allocator_type *)&local_c8);
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(points_cache,(long)n);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_f8,(long)n);
  uVar12 = 0;
  local_70 = (ulong)(uint)n;
  if (n < 1) {
    local_70 = uVar12;
  }
  while( true ) {
    if (uVar12 == local_70) break;
    local_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&local_a8,(double *)&local_60);
    if (uVar12 != 0) {
      dVar13 = 0.0;
      dVar14 = 0.0;
      for (lVar11 = 0;
          (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != lVar11; lVar11 = lVar11 + 1) {
        dVar1 = (ref_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        dVar13 = dVar13 + dVar1 * local_88._M_impl.super__Vector_impl_data._M_start[lVar11] *
                                  local_88._M_impl.super__Vector_impl_data._M_start[lVar11];
        dVar14 = dVar14 + dVar1 * local_e8._M_impl.super__Vector_impl_data._M_start[lVar11] *
                                  local_e8._M_impl.super__Vector_impl_data._M_start[lVar11];
      }
      dVar14 = dVar14 / dVar13;
      if (dVar14 < 0.0) {
        local_60._M_impl.super__Vector_impl_data._M_start = (pointer)sqrt(dVar14);
      }
      else {
        local_60._M_impl.super__Vector_impl_data._M_start = (pointer)SQRT(dVar14);
      }
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_c8,(double *)&local_60);
    }
    local_68 = uVar12;
    if (gauss_quadrature_version == '\0') {
      TasGrid::TasmanianTridiagonalSolver::getSymmetricEigenvalues
                ((int)(vector *)&local_60,(vector *)(ulong)((int)uVar12 + 1),(vector *)&local_a8);
      std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((points_cache->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar12,(vector *)&local_60);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
      pvVar5 = (points_cache->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = *(long *)&pvVar5[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data;
      uVar9 = (long)*(pointer *)
                     ((long)&pvVar5[uVar12].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data + 8) - lVar11;
      __n = (long)uVar9 >> 3;
      if ((uVar9 & 8) != 0) {
        *(undefined8 *)(lVar11 + -4 + __n * 4) = 0;
      }
      local_48[0] = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_60,__n,local_48,&local_f9);
      std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((local_f8->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar12,&local_60);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
      for (uVar9 = 0;
          pvVar5 = (points_cache->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)*(pointer *)
                                 ((long)&pvVar5[uVar12].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + 8) -
                          *(long *)&pvVar5[uVar12].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data >> 3); uVar9 = uVar9 + 1) {
        for (uVar10 = 0;
            pdVar2 = (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start,
            uVar10 < (ulong)((long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3);
            uVar10 = uVar10 + 1) {
          dVar14 = lagrange_eval(uVar9,(points_cache->
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar12,
                                 pdVar2[uVar10]);
          lVar11 = *(long *)&(local_f8->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar12].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          *(double *)(lVar11 + uVar9 * 8) =
               dVar14 * (ref_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10] + *(double *)(lVar11 + uVar9 * 8);
        }
      }
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_60,
                 (vector<double,_std::allocator<double>_> *)&local_a8);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_48,
                 (vector<double,_std::allocator<double>_> *)&local_c8);
      TasGrid::TasmanianTridiagonalSolver::decompose
                ((vector *)&local_60,(vector *)local_48,local_f0,
                 (vector *)
                 ((points_cache->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar12),
                 (vector *)
                 ((local_f8->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)local_48);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
    }
    uVar12 = local_68;
    pdVar7 = local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar6 = local_88._M_impl.super__Vector_impl_data._M_finish;
    pdVar3 = local_88._M_impl.super__Vector_impl_data._M_start;
    pdVar2 = local_e8._M_impl.super__Vector_impl_data._M_start;
    local_e8._M_impl.super__Vector_impl_data._M_start =
         local_88._M_impl.super__Vector_impl_data._M_start;
    local_88._M_impl.super__Vector_impl_data._M_start = pdVar2;
    local_88._M_impl.super__Vector_impl_data._M_finish =
         local_e8._M_impl.super__Vector_impl_data._M_finish;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_e8._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8._M_impl.super__Vector_impl_data._M_finish = pdVar6;
    local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar7;
    __unary_op._8_8_ = local_68 & 0xffffffff;
    __unary_op.points_cache = points_cache;
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,TasGrid::getGaussNodesAndWeights<true>(int,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&)::_lambda(double)_1_>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)pdVar3,
               __unary_op);
    uVar12 = uVar12 + 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_e8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

inline void getGaussNodesAndWeights(const int n, const std::vector<double> &ref_points, const std::vector<double> &ref_weights,
                                    std::vector<std::vector<double>> &points_cache, std::vector<std::vector<double>> &weights_cache) {
    #ifndef Tasmanian_ENABLE_BLAS
    // If BLAS is not enabled, we must use an implementation that does not require it.
    if (gauss_quadrature_version == 1) {
        gauss_quadrature_version = 2;
    }
    #endif
    // Compute the roots incrementally.
    assert(ref_points.size() == ref_weights.size());
    assert(ref_points.size() > 0);
    double mu0 = 0.0;
    for (auto &w : ref_weights) mu0 += w;
    std::vector<double> poly_m1_vals(ref_points.size(), 0.0), poly_vals(ref_points.size(), 1.0);
    std::vector<double> diag, offdiag;
    points_cache.resize(n);
    weights_cache.resize(n);
    for (int i=0; i<n; i++) {
        // Form the diagonal and offdiagonal vectors of the Jacobi matrix.
        if (is_symmetric) {
            diag.push_back(0.0);
        } else {
            double diag_numr = 0.0;
            double diag_denm = 0.0;
            for (size_t j=0; j<ref_points.size(); j++) {
            diag_numr += ref_points[j] * (poly_vals[j] * poly_vals[j]) * ref_weights[j];
            diag_denm += (poly_vals[j] * poly_vals[j]) * ref_weights[j];
            }
            diag.push_back(diag_numr / diag_denm);
        }
        if (i >= 1) {
            double sqr_offdiag_numr = 0.0;
            double sqr_offdiag_denm = 0.0;
            for (size_t j=0; j<ref_points.size(); j++) {
                sqr_offdiag_numr += (poly_vals[j] * poly_vals[j]) * ref_weights[j];
                sqr_offdiag_denm += (poly_m1_vals[j] * poly_m1_vals[j])  * ref_weights[j];
            }
            offdiag.push_back(std::sqrt(sqr_offdiag_numr / sqr_offdiag_denm));
        }
        // Compute the Gauss points and weights.
        if (gauss_quadrature_version == 1) {
            // Use LAPACK to obtain the Gauss points, and use the reference points and weights to obtain the Gauss weights.
            // Note that the matrix is always symmetric even if the weights function is not.
            points_cache[i] = TasmanianTridiagonalSolver::getSymmetricEigenvalues(i+1, diag, offdiag);
            if (points_cache[i].size() % 2 == 1 && is_symmetric) {
                points_cache[i][(points_cache[i].size() - 1) / 2] = 0.0;
            }
            weights_cache[i] = std::vector<double>(points_cache[i].size(), 0.0);
            for (size_t j=0; j<points_cache[i].size(); j++) {
                // Integrate the function l_j(x) according to the measure induced by the function [weight_fn(x) + shift].
                for (size_t k=0; k<ref_points.size(); k++) {
                    weights_cache[i][j] += lagrange_eval(j, points_cache[i], ref_points[k]) * ref_weights[k];
                }
            }
        } else if (gauss_quadrature_version == 2) {
            // Use TasmanianTridiagonalSolver::decompose().
            std::vector<double> dummy_diag = diag;
            std::vector<double> dummy_offdiag = offdiag;
            TasmanianTridiagonalSolver::decompose(dummy_diag, dummy_offdiag, mu0, points_cache[i], weights_cache[i]);
        } else {
            throw std::invalid_argument("ERROR: gauss_quadrature_version must be a valid number!");
        }
        // Update the values of the polynomials at ref_points.
        std::swap(poly_m1_vals, poly_vals);
        std::transform(ref_points.begin(), ref_points.end(), poly_vals.begin(),
                       [&points_cache, i](double x){return poly_eval(points_cache[i], x);});
    }
}